

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O3

void __thiscall ram::MinimizerEngine::Filter(MinimizerEngine *this,double frequency)

{
  pointer pIVar1;
  ulong uVar2;
  long lVar3;
  invalid_argument *this_00;
  _Hash_node_base *p_Var4;
  Index *it;
  pointer pIVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> occurrences;
  uint local_5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  double local_38;
  
  if ((frequency < 0.0) || (1.0 < frequency)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[ram::MinimizerEngine::Filter] error: invalid frequency");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((frequency != 0.0) || (NAN(frequency))) {
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    pIVar5 = (this->index_).
             super__Vector_base<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (this->index_).
             super__Vector_base<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar5 != pIVar1) {
      local_38 = frequency;
      do {
        for (p_Var4 = (pIVar5->locator)._M_h._M_before_begin._M_nxt;
            p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
          if (((ulong)p_Var4[1]._M_nxt & 1) == 0) {
            local_5c = *(uint *)&p_Var4[2]._M_nxt;
            if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_58,
                         (iterator)
                         local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_5c);
            }
            else {
              *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_5c;
LAB_00111f0a:
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            local_5c = 1;
            if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = 1;
              goto LAB_00111f0a;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                      (&local_58,
                       (iterator)
                       local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(int *)&local_5c);
          }
        }
        pIVar5 = pIVar5 + 1;
        if (pIVar5 == pIVar1) {
          if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this->occurrence_ = 0xffffffff;
            if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == (uint *)0x0) {
              return;
            }
          }
          else {
            local_38 = 1.0 - local_38;
            uVar2 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2;
            auVar8._8_4_ = (int)((long)local_58.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_58.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 0x22);
            auVar8._0_8_ = uVar2;
            auVar8._12_4_ = 0x45300000;
            dVar6 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * local_38;
            if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + (long)dVar6 !=
                local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              lVar3 = 0x3f;
              if (uVar2 != 0) {
                for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
                }
              }
              std::
              __introselect<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        ();
              lVar3 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2;
              auVar7._8_4_ = (int)((long)local_58.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_58.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 0x22);
              auVar7._0_8_ = lVar3;
              auVar7._12_4_ = 0x45300000;
              dVar6 = local_38 *
                      ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
            }
            this->occurrence_ =
                 local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6] + 1;
          }
          operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          return;
        }
      } while( true );
    }
  }
  this->occurrence_ = 0xffffffff;
  return;
}

Assistant:

void MinimizerEngine::Filter(double frequency) {
  if (!(0 <= frequency && frequency <= 1)) {
    throw std::invalid_argument(
        "[ram::MinimizerEngine::Filter] error: invalid frequency");
  }

  if (frequency == 0) {
    occurrence_ = -1;
    return;
  }

  std::vector<std::uint32_t> occurrences;
  for (const auto& it : index_) {
    for (const auto& jt : it.locator) {
      if (jt.first & 1) {
        occurrences.emplace_back(1);
      } else {
        occurrences.emplace_back(static_cast<std::uint32_t>(jt.second));
      }
    }
  }

  if (occurrences.empty()) {
    occurrence_ = -1;
    return;
  }

  std::nth_element(
      occurrences.begin(),
      occurrences.begin() + (1 - frequency) * occurrences.size(),
      occurrences.end());
  occurrence_ = occurrences[(1 - frequency) * occurrences.size()] + 1;
}